

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

void __thiscall Enterprise::Nick::output_pixel<8,false>(Nick *this,uint16_t *target,int columns)

{
  uint8_t source;
  uint8_t source_00;
  uint16_t uVar1;
  int local_24;
  int iStack_20;
  uint8_t pixels [2];
  int c;
  int index;
  int columns_local;
  uint16_t *target_local;
  Nick *this_local;
  
  iStack_20 = 0;
  _index = target;
  for (local_24 = 0; local_24 < columns; local_24 = local_24 + 1) {
    source = this->ram_[(int)((uint)this->line_data_pointer_[0] + iStack_20 & 0xffff)];
    source_00 = this->ram_[(int)((uint)this->line_data_pointer_[0] + iStack_20 + 1 & 0xffff)];
    iStack_20 = iStack_20 + 2;
    this->last_read_ = source_00;
    uVar1 = anon_unknown.dwarf_aa827f::mapped_colour(source);
    *_index = uVar1;
    uVar1 = anon_unknown.dwarf_aa827f::mapped_colour(source_00);
    _index[1] = uVar1;
    _index = _index + 2;
  }
  return;
}

Assistant:

void Nick::output_pixel(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	int index = 0;
	for(int c = 0; c < columns; c++) {
		uint8_t pixels[2] = {
			ram_[(line_data_pointer_[0] + index) & 0xffff],
			ram_[(line_data_pointer_[0] + index + 1) & 0xffff]
		};
		index += is_lpixel ? 1 : 2;
		last_read_ = pixels[1];

		switch(bpp) {
			default:
			case 1: {
				const uint16_t *palette = alt_ind_palettes[((pixels[0] >> 6) & 0x02) | (pixels[0]&1)];
				pixels[0] &= two_colour_mask_;
				output1bpp(pixels[0]);

				if constexpr (!is_lpixel) {
					palette = alt_ind_palettes[((pixels[1] >> 6) & 0x02) | (pixels[1]&1)];
					pixels[1] &= two_colour_mask_;
					output1bpp(pixels[1]);
				}
			} break;

			case 2:
				output2bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output2bpp(pixels[1]);
				}
			break;

			case 4:
				output4bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output4bpp(pixels[1]);
				}
			break;

			case 8:
				output8bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output8bpp(pixels[1]);
				}
			break;
		}
	}
}